

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreaTest.cpp
# Opt level: O1

void printInt(int num)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"num: ",5);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,num);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    sleep(1);
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  return;
}

Assistant:

void printInt(int num)
{
    for(int i=0;i<2;++i)
    {
        std::cout << "num: " << num << std::endl;
        ::sleep(1);
    }
}